

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O1

void __thiscall TadsThreadList::clean(TadsThreadList *this)

{
  OS_Counter *pOVar1;
  TadsThreadLink *pTVar2;
  CVmWeakRef *pCVar3;
  TadsThreadLink **ppTVar4;
  TadsThreadLink *pTVar5;
  TadsThreadLink *pTVar6;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mu->h);
  if (this->head != (TadsThreadLink *)0x0) {
    pTVar5 = (TadsThreadLink *)0x0;
    pTVar6 = this->head;
    do {
      pTVar2 = pTVar6->nxt;
      if (pTVar6->thread->ref_ == (CVmWeakRefable *)0x0) {
        ppTVar4 = &pTVar5->nxt;
        if (pTVar5 == (TadsThreadLink *)0x0) {
          ppTVar4 = &this->head;
        }
        *ppTVar4 = pTVar2;
        pCVar3 = pTVar6->thread;
        LOCK();
        pOVar1 = &(pCVar3->super_CVmRefCntObj).cnt;
        (pOVar1->cnt).super___atomic_base<long>._M_i =
             (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
        UNLOCK();
        if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
          (*(pCVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
        }
        operator_delete(pTVar6,0x10);
        pTVar6 = pTVar5;
      }
      pTVar5 = pTVar6;
      pTVar6 = pTVar2;
    } while (pTVar2 != (TadsThreadLink *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
  return;
}

Assistant:

void clean()
    {
        /* lock the list */
        mu->lock();

        /* 
         *   Unlink the thread from the list.  It's possible that it's not in
         *   the list any longer, since wait_all() removes threads before
         *   waiting for them to exit.  
         */
        TadsThreadLink *cur, *prv, *nxt;
        for (prv = 0, cur = head ; cur != 0 ; cur = nxt)
        {
            /* remember the next thread */
            nxt = cur->nxt;
            
            /* check to see if this thread is still alive */
            if (cur->thread->test())
            {
                /* it's still alive - keep it in the list */
                prv = cur;
            }
            else
            {
                /* this thread is gone - remove the link */
                if (prv != 0)
                    prv->nxt = nxt;
                else
                    head = nxt;

                /* delete the link */
                delete cur;
            }
        }

        /* done with the list lock */
        mu->unlock();
    }